

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O0

void __thiscall
LockedPoolManager::LockedPoolManager
          (LockedPoolManager *this,
          unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *allocator_in)

{
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>
  *in_stack_ffffffffffffffc8;
  LockedPool *this_00;
  _List_node_base *local_8;
  
  local_8 = *(_List_node_base **)(in_FS_OFFSET + 0x28);
  this_00 = (LockedPool *)&stack0xfffffffffffffff0;
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::unique_ptr
            (in_stack_ffffffffffffffc8,
             (unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_> *)0x1b1e7d9
            );
  LockedPool::LockedPool(this_00,in_RDI,(LockingFailed_Callback)in_stack_ffffffffffffffc8);
  std::unique_ptr<LockedPageAllocator,_std::default_delete<LockedPageAllocator>_>::~unique_ptr
            (&this_00->allocator);
  if (*(_List_node_base **)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

LockedPoolManager::LockedPoolManager(std::unique_ptr<LockedPageAllocator> allocator_in):
    LockedPool(std::move(allocator_in), &LockedPoolManager::LockingFailed)
{
}